

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  secp256k1_modinv64_modinfo *modinfo_00;
  int64_t iVar2;
  int64_t iVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  undefined8 uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int local_144;
  long local_140;
  ulong local_138;
  ulong local_120;
  ulong local_118;
  secp256k1_modinv64_modinfo *local_110;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 local_58;
  
  d.v[2] = 0;
  d.v[3] = 0;
  d.v[4] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  local_58.v[3] = 0;
  local_58.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[2] = 0;
  local_58.v[0] = 1;
  f.v[4] = (modinfo->modulus).v[4];
  f.v[0] = (modinfo->modulus).v[0];
  f.v[1] = (modinfo->modulus).v[1];
  f.v[2] = (modinfo->modulus).v[2];
  f.v[3] = (modinfo->modulus).v[3];
  g.v[4] = x->v[4];
  g.v[0] = x->v[0];
  g.v[1] = x->v[1];
  g.v[2] = x->v[2];
  g.v[3] = x->v[3];
  iVar11 = 0;
  local_144 = 5;
  local_140 = -1;
  local_110 = modinfo;
  do {
    iVar3 = g.v[0];
    iVar2 = f.v[0];
    uVar16 = 1;
    local_118 = 0;
    local_120 = f.v[0];
    iVar17 = 0x3e;
    uVar20 = g.v[0];
    uVar15 = 0;
    local_138 = uVar16;
    while( true ) {
      uVar21 = uVar15;
      uVar4 = secp256k1_ctz64_var(-1L << ((byte)iVar17 & 0x3f) | uVar20);
      local_140 = local_140 - (ulong)uVar4;
      bVar6 = (byte)uVar4;
      uVar19 = uVar20 >> (bVar6 & 0x3f);
      local_138 = local_138 << (bVar6 & 0x3f);
      uVar15 = local_118 << (bVar6 & 0x3f);
      iVar17 = iVar17 - uVar4;
      if (iVar17 == 0) break;
      if ((local_120 & 1) == 0) {
        pcVar14 = "test condition failed: (f & 1) == 1";
        uVar10 = 0x101;
        goto LAB_0012b905;
      }
      if ((uVar19 & 1) == 0) {
        pcVar14 = "test condition failed: (g & 1) == 1";
        uVar10 = 0x102;
        goto LAB_0012b905;
      }
      bVar6 = 0x3e - (char)iVar17;
      if (uVar15 * iVar3 + local_138 * iVar2 != local_120 << (bVar6 & 0x3f)) {
        pcVar14 = "test condition failed: (u * f0 + v * g0) == f << (62 - i)";
        uVar10 = 0x103;
        goto LAB_0012b905;
      }
      if (uVar16 * iVar3 + uVar21 * iVar2 != uVar19 << (bVar6 & 0x3f)) {
        pcVar14 = "test condition failed: (q * f0 + r * g0) == g << (62 - i)";
        uVar10 = 0x104;
        goto LAB_0012b905;
      }
      if (local_140 - 0x2eaU < 0xfffffffffffffa2d) {
        pcVar14 = "test condition failed: eta >= -745 && eta <= 745";
        uVar10 = 0x106;
        goto LAB_0012b905;
      }
      iVar18 = (int)uVar19;
      if (local_140 < 0) {
        local_140 = -local_140;
        iVar7 = (int)local_140 + 1;
        if (iVar17 <= iVar7) {
          iVar7 = iVar17;
        }
        if (iVar7 - 0x3fU < 0xffffffc2) {
          pcVar14 = "test condition failed: limit > 0 && limit <= 62";
          uVar10 = 0x112;
          goto LAB_0012b905;
        }
        uVar15 = -uVar15;
        uVar12 = -local_138;
        uVar20 = -local_120;
        uVar5 = (ulong)(0x3fL << (-(char)iVar7 & 0x3fU)) >> (-(char)iVar7 & 0x3fU);
        uVar4 = (iVar18 * iVar18 + 0x3e) * iVar18 * (int)uVar20 & (uint)uVar5;
        local_118 = uVar16;
      }
      else {
        iVar7 = (int)local_140 + 1;
        if (iVar17 <= iVar7) {
          iVar7 = iVar17;
        }
        if (iVar7 - 0x3fU < 0xffffffc2) {
          pcVar14 = "test condition failed: limit > 0 && limit <= 62";
          uVar10 = 0x11c;
          goto LAB_0012b905;
        }
        uVar5 = (ulong)(0xfL << (-(char)iVar7 & 0x3fU)) >> (-(char)iVar7 & 0x3fU);
        uVar4 = -(iVar18 * (((int)local_120 * 2 + 2U & 8) + (int)local_120)) & (uint)uVar5;
        local_118 = uVar15;
        uVar12 = uVar21;
        uVar15 = uVar16;
        uVar20 = uVar19;
        uVar21 = local_138;
        uVar19 = local_120;
      }
      uVar8 = (ulong)uVar4;
      uVar20 = uVar20 + uVar8 * uVar19;
      uVar16 = uVar15 + uVar8 * local_118;
      uVar15 = uVar21 * uVar8 + uVar12;
      local_138 = uVar21;
      local_120 = uVar19;
      if ((uVar20 & uVar5) != 0) {
        pcVar14 = "test condition failed: (g & m) == 0";
        uVar10 = 0x127;
        goto LAB_0012b905;
      }
    }
    t.u = local_138;
    t.v = uVar15;
    t.q = uVar21;
    t.r = uVar16;
    iVar17 = secp256k1_modinv64_det_check_pow2(&t,0x3e,0);
    modinfo_00 = local_110;
    if (iVar17 == 0) {
      pcVar14 = "test condition failed: secp256k1_modinv64_det_check_pow2(t, 62, 0)";
      uVar10 = 0x133;
      goto LAB_0012b905;
    }
    secp256k1_modinv64_update_de_62(&d,&local_58,&t,local_110);
    iVar17 = secp256k1_modinv64_mul_cmp_62(&f,local_144,&modinfo_00->modulus,-1);
    if (iVar17 < 1) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0";
      uVar10 = 0x292;
      goto LAB_0012b905;
    }
    lVar9 = 1;
    iVar17 = secp256k1_modinv64_mul_cmp_62(&f,local_144,&modinfo_00->modulus,1);
    if (0 < iVar17) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0";
      uVar10 = 0x293;
      goto LAB_0012b905;
    }
    iVar17 = secp256k1_modinv64_mul_cmp_62(&g,local_144,&modinfo_00->modulus,-1);
    if (iVar17 < 1) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0";
      uVar10 = 0x294;
      goto LAB_0012b905;
    }
    iVar17 = secp256k1_modinv64_mul_cmp_62(&g,local_144,&modinfo_00->modulus,1);
    if (-1 < iVar17) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0";
      uVar10 = 0x295;
      goto LAB_0012b905;
    }
    secp256k1_modinv64_update_fg_62_var(local_144,&f,&g,&t);
    lVar13 = (long)local_144;
    if (g.v[0] == 0) {
      uVar20 = 0;
      for (; lVar9 < lVar13; lVar9 = lVar9 + 1) {
        uVar20 = uVar20 | g.v[lVar9];
      }
      if (uVar20 == 0) {
        iVar11 = secp256k1_modinv64_mul_cmp_62(&g,local_144,&SECP256K1_SIGNED62_ONE,0);
        if (iVar11 != 0) {
          pcVar14 = 
          "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0"
          ;
          uVar10 = 699;
          goto LAB_0012b905;
        }
        iVar11 = secp256k1_modinv64_mul_cmp_62(&f,local_144,&SECP256K1_SIGNED62_ONE,-1);
        if (iVar11 != 0) {
          iVar11 = secp256k1_modinv64_mul_cmp_62(&f,local_144,&SECP256K1_SIGNED62_ONE,1);
          if (iVar11 != 0) {
            iVar11 = secp256k1_modinv64_mul_cmp_62(x,5,&SECP256K1_SIGNED62_ONE,0);
            if (iVar11 == 0) {
              iVar11 = secp256k1_modinv64_mul_cmp_62(&d,5,&SECP256K1_SIGNED62_ONE,0);
              if (iVar11 == 0) {
                iVar11 = secp256k1_modinv64_mul_cmp_62(&f,local_144,&modinfo_00->modulus,1);
                if (iVar11 == 0) goto LAB_0012b876;
              }
            }
            pcVar14 = 
            "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 || secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 || (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0)"
            ;
            uVar10 = 0x2c1;
            goto LAB_0012b905;
          }
        }
LAB_0012b876:
        secp256k1_modinv64_normalize_62(&d,f.v[lVar13 + -1],modinfo_00);
        x->v[4] = d.v[4];
        x->v[2] = d.v[2];
        x->v[3] = d.v[3];
        x->v[0] = d.v[0];
        x->v[1] = d.v[1];
        return;
      }
    }
    lVar9 = f.v[lVar13 + -1];
    lVar1 = g.v[lVar13 + -1];
    if (lVar1 >> 0x3f == lVar1 && (lVar9 >> 0x3f == lVar9 && -1 < lVar13 + -2)) {
      local_144 = local_144 + -1;
      (&local_118)[lVar13] = (&local_118)[lVar13] | lVar9 << 0x3e;
      f.v[lVar13 + 4] = f.v[lVar13 + 4] | lVar1 << 0x3e;
    }
    if (iVar11 == 0xb) {
      pcVar14 = "test condition failed: ++i < 12";
      uVar10 = 0x2b0;
      goto LAB_0012b905;
    }
    iVar17 = secp256k1_modinv64_mul_cmp_62(&f,local_144,&modinfo_00->modulus,-1);
    if (iVar17 < 1) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0";
      uVar10 = 0x2b1;
      goto LAB_0012b905;
    }
    iVar17 = secp256k1_modinv64_mul_cmp_62(&f,local_144,&modinfo_00->modulus,1);
    if (0 < iVar17) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0";
      uVar10 = 0x2b2;
      goto LAB_0012b905;
    }
    iVar17 = secp256k1_modinv64_mul_cmp_62(&g,local_144,&modinfo_00->modulus,-1);
    if (iVar17 < 1) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0";
      uVar10 = 0x2b3;
      goto LAB_0012b905;
    }
    iVar17 = secp256k1_modinv64_mul_cmp_62(&g,local_144,&modinfo_00->modulus,1);
    if (-1 < iVar17) {
      pcVar14 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0";
      uVar10 = 0x2b4;
LAB_0012b905:
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,uVar10,pcVar14);
      abort();
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

static void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;

    /* Do iterations of 62 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 62 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_divsteps_62_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of g is zero, there is a chance that g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn ^ (fn >> 63);
        cond |= gn ^ (gn >> 63);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint64_t)fn << 62;
            g.v[len - 2] |= (uint64_t)gn << 62;
            --len;
        }

        VERIFY_CHECK(++i < 12); /* We should never need more than 12*62 = 744 divsteps */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[len - 1], modinfo);
    *x = d;
}